

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmss.cpp
# Opt level: O1

void __thiscall lmss::heartbeat(lmss *this,int param_1)

{
  int __v;
  ssize_t sVar1;
  int *piVar2;
  system_error *this_00;
  error_category *__ecat;
  uint64_t count;
  undefined1 local_20 [8];
  
  sVar1 = read((this->tfd).fd,local_20,8);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      __v = *piVar2;
      __ecat = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this_00,__v,__ecat,"failed to read timer");
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  usb_dev::heartbeat(&this->usb);
  return;
}

Assistant:

void lmss::heartbeat(int) {
    uint64_t count;
    if (__builtin_expect(::read(*tfd, &count, sizeof(count)), sizeof(count)) < 0) {
        if (errno != EAGAIN) {
            throw std::system_error(errno, std::system_category(), "failed to read timer");
        }
    }
    usb.heartbeat();
}